

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetInputRecordTest_Test::TestBody(Psbt_SetInputRecordTest_Test *this)

{
  allocator<unsigned_char> *this_00;
  pointer *ppuVar1;
  pointer *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  reference pvVar6;
  uchar *puVar7;
  size_type sVar8;
  uchar *puVar9;
  uint *puVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertHelper local_1338;
  Message local_1330;
  ByteData local_1328;
  string local_1310;
  undefined1 local_12f0 [8];
  AssertionResult gtest_ar_14;
  ByteData input_utxo_key1;
  Message local_12c0;
  string local_12b8;
  undefined1 local_1298 [8];
  AssertionResult gtest_ar_13;
  Message local_1280;
  string local_1278;
  string local_1258;
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_12;
  Message local_1220;
  string local_1218;
  string local_11f8;
  undefined1 local_11d8 [8];
  AssertionResult gtest_ar_11;
  Message local_11c0;
  size_type local_11b8;
  int local_11ac;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_10;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  Message local_1178;
  string local_1170;
  string local_1150;
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_9;
  Message local_1118;
  string local_1110;
  string local_10f0;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar_8;
  ByteData get_gval2;
  ByteData get_gval1;
  Psbt local_1078;
  string local_1028;
  AssertHelper local_1008;
  Message local_1000;
  bool local_ff1;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_fc0;
  Message local_fb8;
  bool local_fa9;
  undefined1 local_fa8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f78;
  Message local_f70;
  bool local_f61;
  undefined1 local_f60 [8];
  AssertionResult gtest_ar_;
  string local_f48;
  undefined1 local_f28 [8];
  ByteData global_value2;
  string local_f08;
  allocator local_ee1;
  string local_ee0;
  undefined1 local_ec0 [8];
  ByteData global_key2;
  string local_ea0;
  undefined1 local_e80 [8];
  ByteData global_value1;
  string local_e60;
  allocator local_e39;
  string local_e38;
  undefined1 local_e18 [8];
  ByteData global_key1;
  Message local_df8;
  string local_df0;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar_7;
  Message local_db8;
  string local_db0;
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_6;
  Transaction get_tx2;
  Transaction get_tx1;
  Message local_cf8;
  string local_cf0;
  string local_cd0;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_5;
  Message local_c98;
  string local_c90;
  string local_c70;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar_4;
  KeyData get_val2;
  KeyData get_val1;
  undefined1 local_988 [8];
  Psbt psbt2;
  Message local_930;
  string local_928;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_3;
  Message local_8f0;
  ByteData local_8e8;
  string local_8d0;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  ByteData local_838;
  allocator local_819;
  string local_818;
  ByteData local_7f8;
  allocator local_7d9;
  string local_7d8;
  ByteData local_7b8;
  allocator local_799;
  string local_798;
  ByteData local_778 [2];
  AssertionResult gtest_ar;
  CfdException *except;
  string local_730;
  ByteData local_710;
  allocator local_6f1;
  string local_6f0;
  ByteData local_6d0;
  allocator local_6b1;
  string local_6b0;
  ByteData local_690;
  allocator local_671;
  string local_670;
  ByteData local_650;
  Transaction local_638;
  ByteData local_5f8;
  allocator local_5d9;
  string local_5d8;
  ByteData local_5b8;
  undefined1 local_5a0 [8];
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  undefined1 local_4f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  undefined1 local_4c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  ByteData local_498;
  undefined1 local_480 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  ByteData local_450;
  undefined1 local_438 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_val_bytes;
  undefined1 local_400 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_key_bytes;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_SetInputRecordTest_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/1/1",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/1",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_e0,kTestnet,
             (string *)local_140);
  this_00 = (allocator<unsigned_char> *)
            ((long)&txin_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400,0x22,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&txin_val_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400,0);
  *pvVar6 = '\x06';
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetData
            (&local_450,
             (Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438,&local_450);
  cfd::core::ByteData::~ByteData(&local_450);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetData
            (&local_498,
             (Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_480,&local_498);
  cfd::core::ByteData::~ByteData(&local_498);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4c8,
             (ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f8,
             (ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4c8);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  this_01 = &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_480);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &txout_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f8);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  ppuVar1 = &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400);
  cfd::core::ByteData::ByteData
            ((ByteData *)local_5a0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"00",&local_5d9);
  cfd::core::ByteData::ByteData(&local_5b8,&local_5d8);
  cfd::core::Transaction::Transaction(&local_638,&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_5f8,&local_638.super_AbstractTransaction);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,&local_5b8,&local_5f8);
  cfd::core::ByteData::~ByteData(&local_5f8);
  cfd::core::Transaction::~Transaction(&local_638);
  cfd::core::ByteData::~ByteData(&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"01",&local_671);
  cfd::core::ByteData::ByteData(&local_650,&local_670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6b0,"00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"
             ,&local_6b1);
  cfd::core::ByteData::ByteData(&local_690,&local_6b0);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,&local_650,&local_690);
  cfd::core::ByteData::~ByteData(&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  cfd::core::ByteData::~ByteData(&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"03",&local_6f1);
  cfd::core::ByteData::ByteData(&local_6d0,&local_6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_730,"01000000",(allocator *)((long)&except + 7));
  cfd::core::ByteData::ByteData(&local_710,&local_730);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,&local_6d0,&local_710);
  cfd::core::ByteData::~ByteData(&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)((long)&except + 7));
  cfd::core::ByteData::~ByteData(&local_6d0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"04",&local_799);
  cfd::core::ByteData::ByteData(local_778,&local_798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7d8,"0014962c4e08f336d3afbc3415c9d359ae1040470520",&local_7d9);
  cfd::core::ByteData::ByteData(&local_7b8,&local_7d8);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,local_778,&local_7b8);
  cfd::core::ByteData::~ByteData(&local_7b8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  cfd::core::ByteData::~ByteData(local_778);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  cfd::core::Psbt::SetTxInRecord
            ((Psbt *)local_60,0,
             (ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_818,"00",&local_819);
  cfd::core::ByteData::ByteData(&local_7f8,&local_818);
  cfd::core::Transaction::Transaction((Transaction *)&except_1,&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_838,(AbstractTransaction *)&except_1);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,1,&local_7f8,&local_838);
  cfd::core::ByteData::~ByteData(&local_838);
  cfd::core::Transaction::~Transaction((Transaction *)&except_1);
  cfd::core::ByteData::~ByteData(&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  cfd::core::Psbt::SetTxInRecord
            ((Psbt *)local_60,1,
             (ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_5a0);
  cfd::core::Psbt::GetData(&local_8e8,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8d0,&local_8e8);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8b0,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_8d0);
  cfd::core::ByteData::~ByteData(&local_8e8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar5) {
    testing::Message::Message(&local_8f0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x43a,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_928,(Psbt *)local_60);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_908,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_928);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar5) {
    testing::Message::Message(&local_930);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x43b,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_930);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            ((Psbt *)local_988,
             (ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInKeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_988,0,false);
  cfd::core::Psbt::GetTxInKeyData((KeyData *)&gtest_ar_4.message_,(Psbt *)local_988,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_c70,
             (KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_c90,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_c50,"get_val1.ToString()","key1.ToString()",&local_c70,
             &local_c90);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_c70);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar5) {
    testing::Message::Message(&local_c98);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_c50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x440,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_cd0,(KeyData *)&gtest_ar_4.message_,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_cf0,
             (KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_cb0,"get_val2.ToString()","key2.ToString()",&local_cd0,
             &local_cf0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_cd0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar5) {
    testing::Message::Message(&local_cf8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &get_tx1.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x441,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &get_tx1.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &get_tx1.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  cfd::core::Psbt::GetTxInUtxoFull
            ((Transaction *)
             &get_tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_988,0,false,
             (bool *)0x0);
  cfd::core::Psbt::GetTxInUtxoFull
            ((Transaction *)&gtest_ar_6.message_,(Psbt *)local_988,1,false,(bool *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_db0,
             (AbstractTransaction *)
             &get_tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_d90,"get_tx1.GetHex()","g_psbt_utxo_witness",&local_db0,
             &g_psbt_utxo_witness_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_db0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar5) {
    testing::Message::Message(&local_db8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x445,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_db8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_df0,(AbstractTransaction *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_dd0,"get_tx2.GetHex()","g_psbt_utxo_legacy",&local_df0,
             &g_psbt_utxo_legacy_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_df0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar5) {
    testing::Message::Message(&local_df8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x446,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_df8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_df8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e38,"cfd",&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e60,"dummy1",
             (allocator *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_e18,0xfc,&local_e38,'\0',&local_e60);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ea0,"01020304",
             (allocator *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_e80,&local_ea0);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ee0,"cfd",&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f08,"dummy2",
             (allocator *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_ec0,0xfc,&local_ee0,'\0',&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f48,"00",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_f28,&local_f48);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,(ByteData *)local_e18,(ByteData *)local_e80);
  local_f61 = cfd::core::Psbt::IsFindTxInRecord((Psbt *)local_60,0,(ByteData *)local_e18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f60,&local_f61,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f60);
  if (!bVar5) {
    testing::Message::Message(&local_f70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_f60,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x44d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f78,&local_f70);
    testing::internal::AssertHelper::~AssertHelper(&local_f78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_f70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f60);
  bVar5 = cfd::core::Psbt::IsFindTxInRecord((Psbt *)local_60,0,(ByteData *)local_ec0);
  local_fa9 = (bool)(~bVar5 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa8,&local_fa9,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa8);
  if (!bVar5) {
    testing::Message::Message(&local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_fa8,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x44e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_fc0,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa8);
  cfd::core::Psbt::SetTxInRecord((Psbt *)local_60,0,(ByteData *)local_ec0,(ByteData *)local_f28);
  local_ff1 = cfd::core::Psbt::IsFindTxInRecord((Psbt *)local_60,0,(ByteData *)local_ec0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ff0,&local_ff1,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar5) {
    testing::Message::Message(&local_1000);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1028,(internal *)local_ff0,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1008,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x450,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1008,&local_1000);
    testing::internal::AssertHelper::~AssertHelper(&local_1008);
    std::__cxx11::string::~string((string *)&local_1028);
    testing::Message::~Message(&local_1000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            (&local_1078,
             (ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::operator=((Psbt *)local_988,&local_1078);
  cfd::core::Psbt::~Psbt(&local_1078);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInRecord
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_988,0,
             (ByteData *)local_e18);
  cfd::core::Psbt::GetTxInRecord
            ((ByteData *)&gtest_ar_8.message_,(Psbt *)local_988,0,(ByteData *)local_ec0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_10f0,
             (ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1110,(ByteData *)local_e80);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_10d0,"get_gval1.GetHex()","global_value1.GetHex()",&local_10f0
             ,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::__cxx11::string::~string((string *)&local_10f0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar5) {
    testing::Message::Message(&local_1118);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_10d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x455,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1150,(ByteData *)&gtest_ar_8.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1170,(ByteData *)local_f28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1130,"get_gval2.GetHex()","global_value2.GetHex()",&local_1150
             ,&local_1170);
  std::__cxx11::string::~string((string *)&local_1170);
  std::__cxx11::string::~string((string *)&local_1150);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1130);
  if (!bVar5) {
    testing::Message::Message(&local_1178);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x456,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1130);
  cfd::core::Psbt::GetTxInRecordKeyList
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_,(Psbt *)local_988,0);
  local_11ac = 2;
  local_11b8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &gtest_ar_10.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_11a8,"2","key_list.size()",&local_11ac,&local_11b8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar5) {
    testing::Message::Message(&local_11c0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x459,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_11c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_11c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  sVar8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar_10.message_);
  if (sVar8 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_11f8,(ByteData *)local_e18);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_10.message_,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1218,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_11d8,"global_key1.GetHex()","key_list[0].GetHex()",
               &local_11f8,&local_1218);
    std::__cxx11::string::~string((string *)&local_1218);
    std::__cxx11::string::~string((string *)&local_11f8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11d8);
    if (!bVar5) {
      testing::Message::Message(&local_1220);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_11d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
                 ,0x45b,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_1220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11d8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1258,(ByteData *)local_ec0);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_10.message_,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1278,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1238,"global_key2.GetHex()","key_list[1].GetHex()",
               &local_1258,&local_1278);
    std::__cxx11::string::~string((string *)&local_1278);
    std::__cxx11::string::~string((string *)&local_1258);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1238);
    if (!bVar5) {
      testing::Message::Message(&local_1280);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
                 ,0x45c,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_1280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_1280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1238);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_12b8,(Psbt *)local_988);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1298,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_12b8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1298);
  if (!bVar5) {
    testing::Message::Message(&local_12c0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &input_utxo_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x45e,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &input_utxo_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_12c0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &input_utxo_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_12c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1298);
  cfd::core::Psbt::CreateRecordKey((ByteData *)&gtest_ar_14.message_,'\0');
  cfd::core::Psbt::GetTxInRecord(&local_1328,(Psbt *)local_988,0,(ByteData *)&gtest_ar_14.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1310,&local_1328);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12f0,
             "\"02000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a2830600000000\""
             ,"psbt2.GetTxInRecord(0, input_utxo_key1).GetHex().c_str()",
             "02000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a2830600000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_1310);
  cfd::core::ByteData::~ByteData(&local_1328);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f0);
  if (!bVar5) {
    testing::Message::Message(&local_1330);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_12f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x464,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1338,&local_1330);
    testing::internal::AssertHelper::~AssertHelper(&local_1338);
    testing::Message::~Message(&local_1330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_14.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_8.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData((ByteData *)local_f28);
  cfd::core::ByteData::~ByteData((ByteData *)local_ec0);
  cfd::core::ByteData::~ByteData((ByteData *)local_e80);
  cfd::core::ByteData::~ByteData((ByteData *)local_e18);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_6.message_);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &get_tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_4.message_);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::~Psbt((Psbt *)local_988);
  cfd::core::ByteData::~ByteData((ByteData *)local_5a0);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_480);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_400);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &txin_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, SetInputRecordTest) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);

  std::vector<uint8_t> txin_key_bytes(34);
  std::vector<uint8_t> txin_val_bytes;
  txin_key_bytes[0] = 6;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txin_key_bytes[1], pk_bytes1.data(), 33);
  txin_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txin_val_bytes.data(), fp1.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txin_key_bytes);
  ByteData txout_value1 = ByteData(txin_val_bytes);

  memcpy(&txin_key_bytes[1], pk_bytes2.data(), 33);
  txin_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txin_val_bytes.data(), fp2.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txin_key_bytes);
  ByteData txout_value2 = ByteData(txin_val_bytes);

  psbt.SetTxInRecord(0, ByteData("00"), Transaction(g_psbt_utxo_witness).GetData());
  try {
    psbt.SetTxInRecord(0, ByteData("01"), ByteData("00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"));
    psbt.SetTxInRecord(0, ByteData("03"), ByteData("01000000"));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  psbt.SetTxInRecord(0, ByteData("04"), ByteData("0014962c4e08f336d3afbc3415c9d359ae1040470520"));
  psbt.SetTxInRecord(0, txout_key1, txout_value1);

  try {
    psbt.SetTxInRecord(1, ByteData("00"), Transaction(g_psbt_utxo_legacy).GetData());
    psbt.SetTxInRecord(1, txout_key2, txout_value2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxInKeyData(0);
  auto get_val2 = psbt2.GetTxInKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  auto get_tx1 = psbt2.GetTxInUtxoFull(0);
  auto get_tx2 = psbt2.GetTxInUtxoFull(1);
  EXPECT_EQ(get_tx1.GetHex(), g_psbt_utxo_witness);
  EXPECT_EQ(get_tx2.GetHex(), g_psbt_utxo_legacy);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxInRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxInRecord(0, global_key2));
  psbt.SetTxInRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxInRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxInRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxInRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA", psbt2.GetBase64().c_str());

  ByteData input_utxo_key1 = Psbt::CreateRecordKey(
      Psbt::kPsbtInputNonWitnessUtxo);
  EXPECT_STREQ(
      "02000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a2830600000000",
      psbt2.GetTxInRecord(0, input_utxo_key1).GetHex().c_str());
}